

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgentT.h
# Opt level: O0

void __thiscall
AsyncEventAgent7<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char>::
AsyncEventAgent7(AsyncEventAgent7<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char>
                 *this,TestClass *object,event_method_t method,uint param1,short param2,
                TestClass *param3,char *param4,int param5,bool param6,char param7)

{
  undefined4 in_register_0000000c;
  undefined2 in_register_00000082;
  undefined4 in_stack_00000014;
  undefined3 in_stack_00000019;
  char in_stack_00000028;
  bool param6_local;
  short param2_local;
  uint param1_local;
  event_method_t method_local;
  TestClass *object_local;
  AsyncEventAgent7<TestClass,_unsigned_int,_short,_TestClass_*,_char_*,_int,_bool,_char> *this_local
  ;
  
  AsyncEventAgent::AsyncEventAgent(&this->super_AsyncEventAgent);
  (this->super_AsyncEventAgent).super_EventAgent.super_Event.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR_onRefCountZero_00118470;
  this->mObject = object;
  *(ulong *)&this->field_0x28 = CONCAT44(in_register_0000000c,param1);
  this->mMethod = method;
  this->mParam1 = CONCAT22(in_register_00000082,param2);
  this->mParam2 = (short)param3;
  this->mParam3 = (TestClass *)param4;
  this->mParam4 = (char *)CONCAT44(in_stack_00000014,param5);
  this->mParam5 = _param6;
  this->mParam6 = (bool)(param7 & 1);
  this->mParam7 = in_stack_00000028;
  return;
}

Assistant:

AsyncEventAgent7(ClassType *object, event_method_t method,
					 ParamType1 param1, ParamType2 param2,
					 ParamType3 param3, ParamType4 param4,
					 ParamType5 param5, ParamType6 param6,
					 ParamType7 param7)
	:	mObject(object), mMethod(method),
		mParam1(param1), mParam2(param2),
		mParam3(param3), mParam4(param4),
		mParam5(param5), mParam6(param6),
		mParam7(param7)
	{
	}